

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

void duckdb_zstd::ZSTD_safecopyLiterals(BYTE *op,BYTE *ip,BYTE *iend,BYTE *ilimit_w)

{
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  BYTE *oend;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_38;
  undefined1 *local_30;
  
  local_50 = in_RSI;
  local_48 = in_RDI;
  if (in_RSI <= in_RCX) {
    ZSTD_copy16(in_RDI,in_RSI);
    if (0x10 < (long)in_RCX - (long)in_RSI) {
      local_38 = in_RDI + 0x10;
      local_30 = in_RSI + 0x10;
      do {
        ZSTD_copy16(local_38,local_30);
        ZSTD_copy16(local_38 + 0x10,local_30 + 0x10);
        local_38 = local_38 + 0x20;
        local_30 = local_30 + 0x20;
      } while (local_38 < in_RDI + ((long)in_RCX - (long)in_RSI));
    }
    local_48 = in_RDI + ((long)in_RCX - (long)in_RSI);
    local_50 = in_RCX;
  }
  while (local_50 < in_RDX) {
    *local_48 = *local_50;
    local_50 = local_50 + 1;
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

static void
ZSTD_safecopyLiterals(BYTE* op, BYTE const* ip, BYTE const* const iend, BYTE const* ilimit_w)
{
    assert(iend > ilimit_w);
    if (ip <= ilimit_w) {
        ZSTD_wildcopy(op, ip, ilimit_w - ip, ZSTD_no_overlap);
        op += ilimit_w - ip;
        ip = ilimit_w;
    }
    while (ip < iend) *op++ = *ip++;
}